

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::ssbo::SSBOLayoutCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,SSBOLayoutCaseInstance *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  DataType DVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  BufferBlock *pBVar12;
  BufferLayout *pBVar13;
  pointer pBVar14;
  RefDataStorage *pRVar15;
  pointer pBVar16;
  pointer pSVar17;
  Allocation *pAVar18;
  ProgramCollection<vk::ProgramBinary> *this_00;
  TestLog *pTVar19;
  void *pvVar20;
  int iVar21;
  undefined8 ptr;
  bool bVar22;
  deUint32 queueFamilyIndex;
  VkResult VVar23;
  DataType scalarType;
  int numComps;
  int iVar24;
  int iVar25;
  int iVar26;
  DeviceInterface *vkd;
  VkDevice device;
  VkQueue pVVar27;
  void *pvVar28;
  Unique<vk::Handle<(vk::HandleType)8>_> *pUVar29;
  InstanceInterface *pIVar30;
  VkPhysicalDevice pVVar31;
  uint *puVar32;
  BlockDataPtr *dstBlockPtr;
  ProgramBinary *binary;
  byte bVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  size_type sVar38;
  ulong uVar39;
  size_t bufferNdx;
  void *res;
  int iVar40;
  size_type __n;
  int *piVar41;
  pointer pBVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  void *ref;
  int iVar46;
  int totalSize;
  deUint32 dVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  ulong uVar52;
  int iVar53;
  int iVar54;
  size_t allocNdx;
  long lVar55;
  deUint64 dVar56;
  ulong uVar57;
  Deleter<vk::Handle<(vk::HandleType)8>_> *pDVar58;
  uint uVar59;
  int iVar60;
  long lVar61;
  pointer pBVar62;
  bool bVar63;
  BlockDataPtr BVar64;
  int *local_b30;
  SharedPtr<vk::Allocation> local_a88 [2];
  pointer local_a68;
  pointer local_a60;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> acBufferAlloc;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> mappedBlockPtrs;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptors;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_998;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  DescriptorPoolBuilder poolBuilder;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_928;
  string local_900 [32];
  VkDescriptorBufferInfo descriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_8c8;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Move<vk::Handle<(vk::HandleType)8>_> acBuffer;
  vector<void_*,_std::allocator<void_*>_> mapPtrs;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  VkDevice local_778;
  VkAllocationCallbacks *pVStack_770;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  int local_398;
  VkSubmitInfo submitInfo;
  DescriptorSetUpdateBuilder setUpdateBuilder;
  DescriptorSetLayoutBuilder setLayoutBuilder;
  vector<int,_std::allocator<int>_> bufferSizes;
  VkCommandBufferBeginInfo cmdBufBeginParams;
  VkDescriptorSetAllocateInfo allocInfo;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  pVVar27 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  createBuffer(&acBuffer,(this->super_TestInstance).m_context,0x400,0x20);
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&buffer,
             (this->super_TestInstance).m_context,
             (VkBuffer)
             acBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  acBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&buffer);
  pAVar18 = acBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
            m_data.ptr;
  memset((acBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
         .ptr)->m_hostPtr,0,0x400);
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar18->m_memory).m_internal,pAVar18->m_offset,0x400);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&setLayoutBuilder);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&poolBuilder);
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  uVar37 = (ulong)((long)(this->m_interface->m_bufferBlocks).
                         super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_interface->m_bufferBlocks).
                        super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar52 = 0;
  uVar57 = uVar37 & 0xffffffff;
  if ((int)uVar37 < 1) {
    uVar57 = uVar52;
  }
  uVar59 = 0;
  for (; uVar57 != uVar52; uVar52 = uVar52 + 1) {
    pBVar12 = (this->m_interface->m_bufferBlocks).
              super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar52];
    dVar47 = pBVar12->m_arraySize;
    if ((int)dVar47 < 1) {
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
      iVar40 = 1;
    }
    else {
      ::vk::DescriptorSetLayoutBuilder::addArrayBinding
                (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,dVar47,0x20);
      iVar40 = pBVar12->m_arraySize;
    }
    uVar59 = uVar59 + iVar40;
  }
  ::vk::DescriptorPoolBuilder::addType(&poolBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,uVar59 + 1);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&buffer,&setLayoutBuilder,vkd,device,0);
  local_928.m_data.deleter.m_device =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_928.m_data.deleter.m_allocator =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_928.m_data.object.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_928.m_data.deleter.m_deviceIface =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&buffer);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&buffer,&poolBuilder,vkd,device,1,1);
  local_8c8.m_data.deleter.m_device =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_8c8.m_data.deleter.m_allocator =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_8c8.m_data.object.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_8c8.m_data.deleter.m_deviceIface =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&buffer);
  allocInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = local_8c8.m_data.object.m_internal;
  allocInfo.descriptorSetCount = 1;
  allocInfo.pSetLayouts = (VkDescriptorSetLayout *)&local_928;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&buffer,vkd,device,&allocInfo);
  local_998.m_data.deleter.m_device =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_998.m_data.deleter.m_pool.m_internal =
       (deUint64)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_998.m_data.object.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_998.m_data.deleter.m_deviceIface =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&buffer);
  descriptorInfo.buffer.m_internal =
       acBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorInfo.offset = 0;
  descriptorInfo.range = 0x400;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&setUpdateBuilder);
  __n = (size_type)(int)uVar59;
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            (&descriptors,__n,(allocator_type *)&buffer);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  ::vk::DescriptorSetUpdateBuilder::writeSingle
            (&setUpdateBuilder,(VkDescriptorSet)local_998.m_data.object.m_internal,
             (Location *)&buffer,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&descriptorInfo);
  mappedBlockPtrs.
  super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mappedBlockPtrs.
  super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mappedBlockPtrs.
  super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anon_unknown_15::computeBufferSizes(&bufferSizes,this->m_interface,this->m_refLayout);
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((int)uVar59 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  if (uVar59 == 0) {
    pvVar28 = (void *)0x0;
  }
  else {
    pvVar28 = operator_new(__n * 0xc);
  }
  submitInfo._16_8_ = __n * 0xc + (long)pvVar28;
  lVar45 = 0;
  sVar38 = __n;
  while (bVar63 = sVar38 != 0, sVar38 = sVar38 - 1, bVar63) {
    *(undefined8 *)((long)pvVar28 + lVar45) = 0;
    *(undefined4 *)((long)pvVar28 + lVar45 + 8) = 0;
    lVar45 = lVar45 + 0xc;
  }
  submitInfo.pNext = (void *)((long)pvVar28 + lVar45);
  uVar37 = (ulong)uVar59;
  submitInfo._0_8_ = pvVar28;
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    std::vector<void_*,_std::allocator<void_*>_>::resize(&mapPtrs,__n);
    lVar55 = 4;
    for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
      uVar59 = bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar52];
      *(int *)((long)pvVar28 + lVar55 * 2 + -8) = (int)uVar52;
      *(undefined4 *)((long)pvVar28 + lVar55 * 2 + -4) = 0;
      *(uint *)((long)pvVar28 + lVar55 * 2) = uVar59;
      createBuffer(&buffer,(this->super_TestInstance).m_context,(ulong)uVar59,0x20);
      allocateAndBindMemory
                (&alloc,(this->super_TestInstance).m_context,
                 (VkBuffer)
                 buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                 (MemoryRequirement)0x1);
      *(deUint64 *)
       ((long)descriptors.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar55 * 4 + -0x10) =
           buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
      *(undefined8 *)
       ((long)descriptors.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar55 * 4 + -8) = 0;
      *(ulong *)((long)&((descriptors.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start)->buffer).m_internal +
                lVar55 * 4) = (ulong)uVar59;
      mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar52] =
           (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
           ->m_hostPtr;
      pUVar29 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
      (pUVar29->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device =
           buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      (pUVar29->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
           buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
      (pUVar29->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
      (pUVar29->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
           buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)
                 &pipelineLayoutParams,pUVar29);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                  *)&this->m_uniformBuffers,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)
                 &pipelineLayoutParams);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)
                 &pipelineLayoutParams);
      pAVar18 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                ptr;
      alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)0x0;
      de::SharedPtr<vk::Allocation>::SharedPtr
                ((SharedPtr<vk::Allocation> *)&pipelineLayoutParams,pAVar18);
      std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
      emplace_back<de::SharedPtr<vk::Allocation>>
                ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                  *)&this->m_uniformAllocs,(SharedPtr<vk::Allocation> *)&pipelineLayoutParams);
      de::SharedPtr<vk::Allocation>::release((SharedPtr<vk::Allocation> *)&pipelineLayoutParams);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
      lVar55 = lVar55 + 6;
    }
  }
  else {
    pIVar30 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar31 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    (*pIVar30->_vptr_InstanceInterface[5])(pIVar30,pVVar31,&buffer);
    piVar41 = (int *)((long)pvVar28 + 8);
    iVar40 = 0;
    for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
      iVar3 = bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar52];
      if ((0 < local_398) && ((iVar40 / local_398) * local_398 != iVar40)) {
        iVar40 = (iVar40 / local_398 + 1) * local_398;
      }
      piVar41[-2] = 0;
      piVar41[-1] = iVar40;
      *piVar41 = iVar3;
      iVar40 = iVar40 + iVar3;
      piVar41 = piVar41 + 3;
    }
    createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&alloc,(this->super_TestInstance).m_context
                 ,(long)iVar40,0x20);
    allocateAndBindMemory
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&pipelineLayoutParams
               ,(this->super_TestInstance).m_context,
               (VkBuffer)
               alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               ptr,(MemoryRequirement)0x1);
    local_a88[0].m_ptr = *(Allocation **)(pipelineLayoutParams._0_8_ + 0x18);
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&mapPtrs,&local_a88[0].m_ptr);
    puVar32 = (uint *)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    for (lVar55 = 0; uVar37 * 6 - lVar55 != 0; lVar55 = lVar55 + 6) {
      uVar59 = *puVar32;
      uVar2 = *(uint *)((long)pvVar28 + lVar55 * 2 + 4);
      *(Allocation **)
       ((long)&((descriptors.
                 super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start)->buffer).m_internal + lVar55 * 4) =
           alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      *(ulong *)((long)&(descriptors.
                         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)->offset + lVar55 * 4) =
           (ulong)uVar2;
      *(ulong *)((long)&(descriptors.
                         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)->range + lVar55 * 4) =
           (ulong)uVar59;
      puVar32 = puVar32 + 1;
    }
    pUVar29 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
    (pUVar29->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device = local_778;
    (pUVar29->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
         pVStack_770;
    (pUVar29->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         (deUint64)
         alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    (pUVar29->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)local_a88,
               pUVar29);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                *)&this->m_uniformBuffers,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)local_a88);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)local_a88);
    ptr = pipelineLayoutParams._0_8_;
    pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    pipelineLayoutParams._4_4_ = 0;
    de::SharedPtr<vk::Allocation>::SharedPtr(local_a88,(Allocation *)ptr);
    std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
    emplace_back<de::SharedPtr<vk::Allocation>>
              ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                *)&this->m_uniformAllocs,local_a88);
    de::SharedPtr<vk::Allocation>::release(local_a88);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &pipelineLayoutParams);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&alloc);
  }
  iVar40 = 0;
  for (dVar56 = 1; dVar56 - uVar57 != 1; dVar56 = dVar56 + 1) {
    dVar47 = (this->m_interface->m_bufferBlocks).
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start[dVar56 - 1]->m_arraySize;
    if ((int)dVar47 < 2) {
      dVar47 = 1;
    }
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = dVar56;
    ::vk::DescriptorSetUpdateBuilder::writeArray
              (&setUpdateBuilder,(VkDescriptorSet)local_998.m_data.object.m_internal,
               (Location *)&buffer,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,dVar47,
               descriptors.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar40);
    iVar40 = iVar40 + dVar47;
  }
  pBVar13 = this->m_refLayout;
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::vector
            ((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)&buffer,
             lVar45 / 0xc,(allocator_type *)&alloc);
  local_b30 = (int *)((long)pvVar28 + 8);
  lVar45 = 2;
  lVar61 = 0;
  for (lVar55 = 0;
      pBVar14 = (pBVar13->blocks).
                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar55 < (int)((ulong)((long)(pBVar13->blocks).
                                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar14) >> 6)
      ; lVar55 = lVar55 + 1) {
    BVar64 = anon_unknown_15::getBlockDataPtr
                       (pBVar13,(BlockLayoutEntry *)
                                ((long)&(pBVar14->name)._M_dataplus._M_p + lVar61),
                        (void *)((long)local_b30[-1] +
                                (long)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start[local_b30[-2]]),
                        *local_b30);
    *(void **)((buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal - 8) +
              lVar45 * 4) = BVar64.ptr;
    *(long *)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal +
             lVar45 * 4) = BVar64._8_8_;
    lVar45 = lVar45 + 4;
    local_b30 = local_b30 + 3;
    lVar61 = lVar61 + 0x40;
  }
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::_M_move_assign
            (&mappedBlockPtrs,&buffer);
  std::_Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::
  ~_Vector_base((_Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
                &buffer);
  pBVar13 = this->m_refLayout;
  pRVar15 = this->m_initialData;
  uVar37 = (ulong)((long)(pBVar13->blocks).
                         super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar13->blocks).
                        super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 6;
  uVar52 = 0;
  uVar57 = uVar37 & 0xffffffff;
  if ((int)uVar37 < 1) {
    uVar57 = uVar52;
  }
  for (; uVar52 != uVar57; uVar52 = uVar52 + 1) {
    pBVar14 = (pBVar13->blocks).
              super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar16 = (pRVar15->pointers).
              super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buffer,pBVar14[uVar52].name._M_dataplus._M_p,(allocator<char> *)&alloc);
    uVar59 = BufferLayout::getBlockIndex(pBVar13,(string *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    if (-1 < (int)uVar59) {
      dstBlockPtr = mappedBlockPtrs.
                    super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar59;
      for (piVar41 = *(int **)&pBVar14[uVar52].activeVarIndices.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl;
          piVar41 !=
          pBVar14[uVar52].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish; piVar41 = piVar41 + 1) {
        iVar40 = *piVar41;
        pBVar62 = (pBVar13->bufferVars).
                  super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buffer,pBVar62[iVar40].name._M_dataplus._M_p,(allocator<char> *)&alloc
                  );
        uVar59 = BufferLayout::getVariableIndex(pBVar13,(string *)&buffer);
        std::__cxx11::string::~string((string *)&buffer);
        if (-1 < (int)uVar59) {
          anon_unknown_15::copyBufferVarData
                    ((pBVar13->bufferVars).
                     super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar59,dstBlockPtr,pBVar62 + iVar40
                     ,pBVar16 + uVar52);
        }
      }
    }
  }
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    lVar45 = 0;
    for (uVar57 = 0;
        pSVar17 = (this->m_uniformAllocs).
                  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar57 < (ulong)((long)(this->m_uniformAllocs).
                               super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >> 4);
        uVar57 = uVar57 + 1) {
      lVar55 = *(long *)((long)&pSVar17->m_ptr + lVar45);
      ::vk::flushMappedMemoryRange
                (vkd,device,(VkDeviceMemory)*(deUint64 *)(lVar55 + 8),
                 *(VkDeviceSize *)(lVar55 + 0x10),
                 (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar57]);
      lVar45 = lVar45 + 0x10;
    }
  }
  else {
    iVar40 = 0;
    for (lVar45 = 0;
        (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != lVar45; lVar45 = lVar45 + 1) {
      iVar40 = iVar40 + bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar45];
    }
    pAVar18 = ((this->m_uniformAllocs).
               super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
    ::vk::flushMappedMemoryRange
              (vkd,device,(VkDeviceMemory)(pAVar18->m_memory).m_internal,pAVar18->m_offset,
               (long)iVar40);
  }
  std::
  vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
  ::~vector((vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
             *)&submitInfo);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bufferSizes.super__Vector_base<int,_std::allocator<int>_>);
  ::vk::DescriptorSetUpdateBuilder::update(&setUpdateBuilder,vkd,device);
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 1;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)&local_928;
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)0x0;
  ::vk::createPipelineLayout
            (&pipelineLayout,vkd,device,&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buffer,"compute",(allocator<char> *)&alloc);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&buffer);
  ::vk::createShaderModule(&shaderModule,vkd,device,binary,0);
  std::__cxx11::string::~string((string *)&buffer);
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x1d);
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((ulong)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  ::vk::createComputePipeline
            (&pipeline,vkd,device,(VkPipelineCache)0x0,(VkComputePipelineCreateInfo *)&mapPtrs,
             (VkAllocationCallbacks *)0x0);
  ::vk::createCommandPool(&cmdPool,vkd,device,2,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  ::vk::allocateCommandBuffer
            (&cmdBuffer,vkd,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar23 = (*vkd->_vptr_DeviceInterface[0x49])
                     (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar23,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x844);
  (*vkd->_vptr_DeviceInterface[0x4c])
            (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  (*vkd->_vptr_DeviceInterface[0x56])
            (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
             0,1,&local_998,0,0);
  (*vkd->_vptr_DeviceInterface[0x5d])
            (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1);
  VVar23 = (*vkd->_vptr_DeviceInterface[0x4a])
                     (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar23,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x84b);
  ::vk::createFence(&fence,vkd,device,0,(VkAllocationCallbacks *)0x0);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&cmdBuffer;
  VVar23 = (*vkd->_vptr_DeviceInterface[2])
                     (vkd,pVVar27,1,&submitInfo,
                      fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal);
  ::vk::checkResult(VVar23,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x85c);
  VVar23 = (*vkd->_vptr_DeviceInterface[0x16])(vkd,device,1,&fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar23,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x85d);
  iVar40 = *(acBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
             m_data.ptr)->m_hostPtr;
  if (iVar40 != 1) {
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)((this->super_TestInstance).m_context)->m_testCtx->m_log;
    pDVar58 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pDVar58);
    std::operator<<((ostream *)pDVar58,"Error: ac_numPassed = ");
    std::ostream::operator<<(pDVar58,iVar40);
    std::operator<<((ostream *)pDVar58,", expected ");
    std::ostream::operator<<(pDVar58,1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pDVar58);
  }
  pBVar13 = this->m_refLayout;
  pTVar19 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  pRVar15 = this->m_writeData;
  uVar37 = (ulong)((long)(pBVar13->blocks).
                         super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar13->blocks).
                        super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 6;
  uVar57 = uVar37 & 0xffffffff;
  if ((int)uVar37 < 1) {
    uVar57 = 0;
  }
  uVar37 = 0;
  bVar33 = 1;
  do {
    if (uVar37 == uVar57) {
      if ((iVar40 != 1) || ((bool)(bVar33 ^ 1))) {
        if (iVar40 == 1 && bVar33 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&buffer,"Result comparison failed",(allocator<char> *)&alloc);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&buffer);
        }
        else if (bVar33 == 0xff && iVar40 != 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&buffer,"Counter value incorrect",(allocator<char> *)&alloc);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&buffer);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&buffer,"Result comparison and counter values are incorrect",
                     (allocator<char> *)&alloc);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&buffer);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buffer,"Result comparison and counter values are OK",
                   (allocator<char> *)&alloc);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)&buffer);
      }
      std::__cxx11::string::~string((string *)&buffer);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
                (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>);
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                (&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                (&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                (&shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                (&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>);
      std::_Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::
      ~_Vector_base(&mappedBlockPtrs.
                     super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                   );
      std::_Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
      ~_Vector_base(&descriptors.
                     super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                   );
      ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&setUpdateBuilder);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_998);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_8c8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_928);
      std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
      ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                     *)&poolBuilder);
      ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&setLayoutBuilder);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&acBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                (&acBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
      return __return_storage_ptr__;
    }
    pBVar14 = (pBVar13->blocks).
              super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar16 = (pRVar15->pointers).
              super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buffer,pBVar14[uVar37].name._M_dataplus._M_p,(allocator<char> *)&alloc);
    uVar59 = BufferLayout::getBlockIndex(pBVar13,(string *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    if (-1 < (int)uVar59) {
      local_a68 = mappedBlockPtrs.
                  super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar59;
      for (piVar41 = *(int **)&pBVar14[uVar37].activeVarIndices.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl;
          piVar41 !=
          pBVar14[uVar37].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish; piVar41 = piVar41 + 1) {
        iVar3 = *piVar41;
        pBVar62 = (pBVar13->bufferVars).
                  super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buffer,pBVar62[iVar3].name._M_dataplus._M_p,(allocator<char> *)&alloc)
        ;
        uVar59 = BufferLayout::getVariableIndex(pBVar13,(string *)&buffer);
        std::__cxx11::string::~string((string *)&buffer);
        if (-1 < (int)uVar59) {
          pBVar62 = pBVar62 + iVar3;
          pBVar42 = (pBVar13->bufferVars).
                    super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar3 = pBVar42[uVar59].offset;
          pvVar28 = local_a68->ptr;
          iVar4 = pBVar62->offset;
          pvVar20 = pBVar16[uVar37].ptr;
          scalarType = glu::getDataTypeScalarType(pBVar62->type);
          pBVar42 = pBVar42 + uVar59;
          numComps = glu::getDataTypeScalarSize(pBVar42->type);
          DVar5 = pBVar42->type;
          uVar59 = pBVar42->arraySize;
          if (pBVar42->arraySize == 0) {
            uVar59 = local_a68->lastUnsizedArraySize;
          }
          uVar2 = pBVar42->topLevelArraySize;
          if (pBVar42->topLevelArraySize == 0) {
            uVar2 = local_a68->lastUnsizedArraySize;
          }
          iVar6 = pBVar42->arrayStride;
          iVar7 = pBVar42->topLevelArrayStride;
          iVar8 = pBVar62->arrayStride;
          iVar9 = pBVar62->topLevelArrayStride;
          uVar52 = 0;
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          iVar48 = 0;
          local_a60 = pBVar42;
          for (; uVar52 != uVar2; uVar52 = uVar52 + 1) {
            iVar34 = (int)uVar52;
            uVar39 = 0;
            while( true ) {
              pDVar58 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter;
              if (uVar39 == uVar59) break;
              iVar35 = (int)uVar39;
              ref = (void *)((long)pvVar28 +
                            (long)(iVar6 * iVar35) + (long)(iVar7 * iVar34) + (long)iVar3);
              res = (void *)((long)pvVar20 +
                            (long)(iVar8 * iVar35) + (long)(iVar9 * iVar34) + (long)iVar4);
              iVar51 = iVar48;
              if (DVar5 - TYPE_DOUBLE_MAT2 < 9 || DVar5 - TYPE_FLOAT_MAT2 < 9) {
                iVar24 = glu::getDataTypeMatrixNumRows(pBVar42->type);
                iVar25 = glu::getDataTypeMatrixNumColumns(pBVar42->type);
                bVar63 = pBVar42->isRowMajor;
                iVar10 = pBVar42->matrixStride;
                bVar1 = pBVar62->isRowMajor;
                iVar50 = 0;
                if (iVar24 < 1) {
                  iVar24 = 0;
                }
                iVar11 = pBVar62->matrixStride;
                if (iVar25 < 1) {
                  iVar25 = iVar50;
                }
                bVar22 = true;
                iVar54 = 0;
                iVar43 = 0;
                for (iVar46 = 0; pBVar42 = local_a60, iVar44 = iVar43, iVar60 = iVar24,
                    iVar53 = iVar54, iVar49 = iVar50, iVar21 = iVar43, iVar46 != iVar25;
                    iVar46 = iVar46 + 1) {
                  while (iVar60 != 0) {
                    if (bVar22 == false) {
                      bVar22 = false;
                    }
                    else {
                      iVar26 = iVar49;
                      if ((bVar1 & 1U) != 0) {
                        iVar26 = iVar21;
                      }
                      iVar36 = iVar53;
                      if ((bVar63 & 1U) != 0) {
                        iVar36 = iVar44;
                      }
                      bVar22 = anon_unknown_15::compareComponents
                                         (scalarType,(void *)((long)iVar36 + (long)ref),
                                          (void *)((long)iVar26 + (long)res),1);
                    }
                    iVar44 = iVar44 + iVar10;
                    iVar60 = iVar60 + -1;
                    iVar53 = iVar53 + 4;
                    iVar49 = iVar49 + 4;
                    iVar21 = iVar21 + iVar11;
                  }
                  iVar43 = iVar43 + 4;
                  iVar54 = iVar54 + iVar10;
                  iVar50 = iVar50 + iVar11;
                }
                if (bVar22 == false) {
                  iVar51 = iVar48 + 1;
                  if (iVar48 + 1 < 3) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&alloc);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufferSizes);
                    anon_unknown_15::generateImmMatrixSrc
                              ((ostream *)&alloc,pBVar62->type,pBVar62->matrixStride,
                               pBVar62->isRowMajor,res);
                    anon_unknown_15::generateImmMatrixSrc
                              ((ostream *)&bufferSizes,pBVar42->type,pBVar42->matrixStride,
                               pBVar42->isRowMajor,ref);
                    pDVar58 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter;
                    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
                         (deUint64)pTVar19;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)pDVar58);
                    std::operator<<((ostream *)pDVar58,"ERROR: mismatch in ");
                    std::operator<<((ostream *)pDVar58,(string *)pBVar62);
                    std::operator<<((ostream *)pDVar58,", top-level ndx ");
                    std::ostream::operator<<(pDVar58,iVar34);
                    std::operator<<((ostream *)pDVar58,", bottom-level ndx ");
                    std::ostream::operator<<(pDVar58,iVar35);
                    std::operator<<((ostream *)pDVar58,":\n");
                    std::operator<<((ostream *)pDVar58,"  expected ");
                    std::__cxx11::stringbuf::str();
                    pDVar58 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter;
                    std::operator<<((ostream *)pDVar58,(string *)local_a88);
                    std::operator<<((ostream *)pDVar58,"\n");
                    std::operator<<((ostream *)pDVar58,"  got ");
                    std::__cxx11::stringbuf::str();
                    std::operator<<((ostream *)
                                    &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                     deleter,local_900);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&buffer,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::string::~string(local_900);
                    std::__cxx11::string::~string((string *)local_a88);
                    goto LAB_00665fca;
                  }
                }
              }
              else {
                bVar63 = anon_unknown_15::compareComponents(scalarType,ref,res,numComps);
                if ((!bVar63) && (iVar51 = iVar48 + 1, iVar48 + 1 < 3)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&alloc);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufferSizes);
                  anon_unknown_15::generateImmScalarVectorSrc((ostream *)&alloc,pBVar62->type,res);
                  anon_unknown_15::generateImmScalarVectorSrc
                            ((ostream *)&bufferSizes,pBVar42->type,ref);
                  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
                       (deUint64)pTVar19;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)pDVar58);
                  std::operator<<((ostream *)pDVar58,"ERROR: mismatch in ");
                  std::operator<<((ostream *)pDVar58,(string *)pBVar62);
                  std::operator<<((ostream *)pDVar58,", top-level ndx ");
                  std::ostream::operator<<(pDVar58,iVar34);
                  std::operator<<((ostream *)pDVar58,", bottom-level ndx ");
                  std::ostream::operator<<(pDVar58,iVar35);
                  std::operator<<((ostream *)pDVar58,":\n");
                  std::operator<<((ostream *)pDVar58,"  expected ");
                  std::__cxx11::stringbuf::str();
                  std::operator<<((ostream *)pDVar58,(string *)local_a88);
                  std::operator<<((ostream *)pDVar58,"\n");
                  std::operator<<((ostream *)pDVar58,"  got ");
                  std::__cxx11::stringbuf::str();
                  std::operator<<((ostream *)pDVar58,local_900);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage)
                  ;
                  std::__cxx11::string::~string(local_900);
                  std::__cxx11::string::~string((string *)local_a88);
LAB_00665fca:
                  std::__cxx11::ostringstream::~ostringstream
                            ((ostringstream *)
                             &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bufferSizes);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&alloc);
                  iVar51 = iVar48 + 1;
                }
              }
              uVar39 = uVar39 + 1;
              iVar48 = iVar51;
            }
          }
          if (2 < iVar48) {
            buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
                 (deUint64)pTVar19;
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)
                       &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter);
            pDVar58 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter;
            std::operator<<((ostream *)pDVar58,"... (");
            std::ostream::operator<<(pDVar58,iVar48);
            std::operator<<((ostream *)pDVar58," failures for ");
            std::operator<<((ostream *)pDVar58,(string *)pBVar62);
            std::operator<<((ostream *)pDVar58," in total)");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)pDVar58);
          }
          bVar33 = bVar33 & iVar48 == 0;
        }
      }
    }
    uVar37 = uVar37 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus SSBOLayoutCaseInstance::iterate (void)
{
	// todo: add compute stage availability check
	const vk::DeviceInterface&	vk					= m_context.getDeviceInterface();
	const vk::VkDevice			device				= m_context.getDevice();
	const vk::VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	// Create descriptor set
	const deUint32 acBufferSize = 1024;
	vk::Move<vk::VkBuffer> acBuffer (createBuffer(m_context, acBufferSize, vk:: VK_BUFFER_USAGE_STORAGE_BUFFER_BIT));
	de::UniquePtr<vk::Allocation> acBufferAlloc (allocateAndBindMemory(m_context, *acBuffer, vk::MemoryRequirement::HostVisible));

	deMemset(acBufferAlloc->getHostPtr(), 0, acBufferSize);
	flushMappedMemoryRange(vk, device, acBufferAlloc->getMemory(), acBufferAlloc->getOffset(), acBufferSize);

	vk::DescriptorSetLayoutBuilder setLayoutBuilder;
	vk::DescriptorPoolBuilder poolBuilder;

	setLayoutBuilder
		.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);

	int numBlocks = 0;
	const int numBindings = m_interface.getNumBlocks();
	for (int bindingNdx = 0; bindingNdx < numBindings; bindingNdx++)
	{
		const BufferBlock& block = m_interface.getBlock(bindingNdx);
		if (block.isArray())
		{
			setLayoutBuilder
				.addArrayBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, block.getArraySize(), vk::VK_SHADER_STAGE_COMPUTE_BIT);
			numBlocks += block.getArraySize();
		}
		else
		{
			setLayoutBuilder
				.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);
			numBlocks += 1;
		}
	}

	poolBuilder
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, (deUint32)(1 + numBlocks));

	const vk::Unique<vk::VkDescriptorSetLayout> descriptorSetLayout(setLayoutBuilder.build(vk, device));
	const vk::Unique<vk::VkDescriptorPool> descriptorPool(poolBuilder.build(vk, device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const vk::VkDescriptorSetAllocateInfo allocInfo =
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		*descriptorPool,
		1u,
		&descriptorSetLayout.get(),
	};

	const vk::Unique<vk::VkDescriptorSet> descriptorSet(allocateDescriptorSet(vk, device, &allocInfo));
	const vk::VkDescriptorBufferInfo descriptorInfo = makeDescriptorBufferInfo(*acBuffer, 0ull, acBufferSize);

	vk::DescriptorSetUpdateBuilder setUpdateBuilder;
	std::vector<vk::VkDescriptorBufferInfo>	descriptors(numBlocks);

	setUpdateBuilder
		.writeSingle(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo);

	vector<BlockDataPtr>  mappedBlockPtrs;

	// Upload base buffers
	{
		const std::vector<int>			bufferSizes		= computeBufferSizes(m_interface, m_refLayout);
		std::vector<void*>				mapPtrs;
		std::vector<BlockLocation>		blockLocations	(numBlocks);

		DE_ASSERT(bufferSizes.size() == m_refLayout.blocks.size());

		if (m_bufferMode == SSBOLayoutCase::BUFFERMODE_PER_BLOCK)
		{
			mapPtrs.resize(numBlocks);
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32 bufferSize = bufferSizes[blockNdx];
				DE_ASSERT(bufferSize > 0);

				blockLocations[blockNdx] = BlockLocation(blockNdx, 0, bufferSize);

				vk::Move<vk::VkBuffer>				buffer		= createBuffer(m_context, bufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
				de::MovePtr<vk::Allocation>			alloc		= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

				descriptors[blockNdx] = makeDescriptorBufferInfo(*buffer, 0ull, bufferSize);

				mapPtrs[blockNdx] = alloc->getHostPtr();

				m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
				m_uniformAllocs.push_back(AllocationSp(alloc.release()));
			}
		}
		else
		{
			DE_ASSERT(m_bufferMode == SSBOLayoutCase::BUFFERMODE_SINGLE);

			vk::VkPhysicalDeviceProperties properties;
			m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &properties);
			const int	bindingAlignment	= (int)properties.limits.minStorageBufferOffsetAlignment;
			int			curOffset			= 0;
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const int bufferSize = bufferSizes[blockNdx];
				DE_ASSERT(bufferSize > 0);

				if (bindingAlignment > 0)
					curOffset = deRoundUp32(curOffset, bindingAlignment);

				blockLocations[blockNdx] = BlockLocation(0, curOffset, bufferSize);
				curOffset += bufferSize;
			}

			const int						totalBufferSize = curOffset;
			vk::Move<vk::VkBuffer>			buffer			= createBuffer(m_context, totalBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
			de::MovePtr<vk::Allocation>		alloc			= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

			mapPtrs.push_back(alloc->getHostPtr());

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32						bufferSize	= bufferSizes[blockNdx];
				const deUint32						offset		= blockLocations[blockNdx].offset;

				descriptors[blockNdx] = makeDescriptorBufferInfo(*buffer, offset, bufferSize);
			}

			m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
			m_uniformAllocs.push_back(AllocationSp(alloc.release()));
		}

		// Update remaining bindings
		{
			int blockNdx = 0;
			for (int bindingNdx = 0; bindingNdx < numBindings; ++bindingNdx)
			{
				const BufferBlock&	block				= m_interface.getBlock(bindingNdx);
				const int			numBlocksInBinding	= (block.isArray() ? block.getArraySize() : 1);

				setUpdateBuilder.writeArray(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(bindingNdx + 1),
					vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, numBlocksInBinding, &descriptors[blockNdx]);

				blockNdx += numBlocksInBinding;
			}
		}

		// Copy the initial data to the storage buffers
		{
			mappedBlockPtrs = blockLocationsToPtrs(m_refLayout, blockLocations, mapPtrs);
			copyData(m_refLayout, mappedBlockPtrs, m_refLayout, m_initialData.pointers);

			if (m_bufferMode == SSBOLayoutCase::BUFFERMODE_PER_BLOCK)
			{
				DE_ASSERT(m_uniformAllocs.size() == bufferSizes.size());
				for (size_t allocNdx = 0; allocNdx < m_uniformAllocs.size(); allocNdx++)
				{
					const int size = bufferSizes[allocNdx];
					vk::Allocation* alloc = m_uniformAllocs[allocNdx].get();
					flushMappedMemoryRange(vk, device, alloc->getMemory(), alloc->getOffset(), size);
				}
			}
			else
			{
				DE_ASSERT(m_bufferMode == SSBOLayoutCase::BUFFERMODE_SINGLE);
				DE_ASSERT(m_uniformAllocs.size() == 1);
				int totalSize = 0;
				for (size_t bufferNdx = 0; bufferNdx < bufferSizes.size(); bufferNdx++)
				{
					totalSize += bufferSizes[bufferNdx];
				}

				DE_ASSERT(totalSize > 0);
				vk::Allocation* alloc = m_uniformAllocs[0].get();
				flushMappedMemoryRange(vk, device, alloc->getMemory(), alloc->getOffset(), totalSize);
			}
		}
	}

	setUpdateBuilder.update(vk, device);

	const vk::VkPipelineLayoutCreateInfo pipelineLayoutParams =
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,	// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		(vk::VkPipelineLayoutCreateFlags)0,
		1u,													// deUint32						descriptorSetCount;
		&*descriptorSetLayout,								// const VkDescriptorSetLayout*	pSetLayouts;
		0u,													// deUint32						pushConstantRangeCount;
		DE_NULL,											// const VkPushConstantRange*	pPushConstantRanges;
	};
	vk::Move<vk::VkPipelineLayout> pipelineLayout(createPipelineLayout(vk, device, &pipelineLayoutParams));

	vk::Move<vk::VkShaderModule> shaderModule (createShaderModule(vk, device, m_context.getBinaryCollection().get("compute"), 0));
	const vk::VkPipelineShaderStageCreateInfo pipelineShaderStageParams =
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		(vk::VkPipelineShaderStageCreateFlags)0,
		vk::VK_SHADER_STAGE_COMPUTE_BIT,						// VkShaderStage				stage;
		*shaderModule,											// VkShader						shader;
		"main",													//
		DE_NULL,												// const VkSpecializationInfo*	pSpecializationInfo;
	};
	const vk::VkComputePipelineCreateInfo pipelineCreateInfo =
	{
		vk::VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0,													// VkPipelineCreateFlags			flags;
		pipelineShaderStageParams,							// VkPipelineShaderStageCreateInfo	stage;
		*pipelineLayout,									// VkPipelineLayout					layout;
		DE_NULL,											// VkPipeline						basePipelineHandle;
		0,													// deInt32							basePipelineIndex;
	};
	vk::Move<vk::VkPipeline> pipeline(createComputePipeline(vk, device, DE_NULL, &pipelineCreateInfo));

	vk::Move<vk::VkCommandPool> cmdPool (createCommandPool(vk, device, vk::VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	vk::Move<vk::VkCommandBuffer> cmdBuffer (allocateCommandBuffer(vk, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const vk::VkCommandBufferBeginInfo cmdBufBeginParams =
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	//	VkStructureType				sType;
		DE_NULL,											//	const void*					pNext;
		0u,													//	VkCmdBufferOptimizeFlags	flags;
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufBeginParams));

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, 1, 1, 1);

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	vk::Move<vk::VkFence> fence (createFence(vk, device));

	const vk::VkSubmitInfo  submitInfo  =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const vk::VkSemaphore*)DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1u,
		&cmdBuffer.get(),
		0u,
		(const vk::VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));

	// Read back ac_numPassed data
	bool counterOk;
	{
		const int refCount = 1;
		int resCount = 0;

		resCount = *(const int*)((const deUint8*)acBufferAlloc->getHostPtr());

		counterOk = (refCount == resCount);
		if (!counterOk)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "Error: ac_numPassed = " << resCount << ", expected " << refCount << TestLog::EndMessage;
		}
	}

	// Validate result
	const bool compareOk = compareData(m_context.getTestContext().getLog(), m_refLayout, m_writeData.pointers, m_refLayout, mappedBlockPtrs);

	if (compareOk && counterOk)
		return tcu::TestStatus::pass("Result comparison and counter values are OK");
	else if (!compareOk && counterOk)
		return tcu::TestStatus::fail("Result comparison failed");
	else if (compareOk && !counterOk)
		return tcu::TestStatus::fail("Counter value incorrect");
	else
		return tcu::TestStatus::fail("Result comparison and counter values are incorrect");
}